

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O2

string * __thiscall
cmSourceFile::GetLanguage_abi_cxx11_(string *__return_storage_ptr__,cmSourceFile *this)

{
  char *__s;
  allocator<char> *__a;
  allocator<char> local_12;
  allocator<char> local_11;
  
  __s = GetProperty(this,&propLANGUAGE_abi_cxx11_);
  if (__s == (char *)0x0) {
    if ((this->Language)._M_string_length != 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->Language);
      return __return_storage_ptr__;
    }
    __s = "";
    __a = &local_12;
  }
  else {
    __a = &local_11;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string cmSourceFile::GetLanguage() const
{
  // If the language was set explicitly by the user then use it.
  if (const char* lang = this->GetProperty(propLANGUAGE)) {
    return lang;
  }

  // If the language was determined from the source file extension use it.
  if (!this->Language.empty()) {
    return this->Language;
  }

  // The language is not known.
  return "";
}